

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O2

int ompt_get_place_num(void)

{
  int iVar1;
  
  if ((((ompt_enabled._0_1_ & 1) != 0) && (iVar1 = __kmp_get_global_thread_id(), -1 < iVar1)) &&
     (__kmp_affin_mask_size != 0)) {
    iVar1 = __kmp_get_global_thread_id_reg();
    if (__kmp_threads[iVar1] != (kmp_info_t *)0x0) {
      iVar1 = (__kmp_threads[iVar1]->th).th_current_place;
      if (iVar1 < 0) {
        return -1;
      }
      return iVar1;
    }
  }
  return -1;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_place_num(void) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return -1;
#else
  if (!ompt_enabled.enabled || __kmp_get_gtid() < 0)
    return -1;

  int gtid;
  kmp_info_t *thread;
  if (!KMP_AFFINITY_CAPABLE())
    return -1;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  if (thread == NULL || thread->th.th_current_place < 0)
    return -1;
  return thread->th.th_current_place;
#endif
}